

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.c
# Opt level: O0

void setup_sig_handlers(_Bool *err)

{
  int iVar1;
  int tmp_err;
  _Bool *err_local;
  
  iVar1 = sigemptyset((sigset_t *)&err_action.sa_mask);
  if (iVar1 == -1) {
    if (err != (_Bool *)0x0) {
      *err = true;
    }
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/validator.c"
                  ,"setup_sig_handlers");
  }
  else {
    err_action.sa_flags = 0;
    err_action.__sigaction_handler.sa_handler = sig_err_handler;
    iVar1 = sigaction(2,(sigaction *)&err_action,(sigaction *)0x0);
    if (iVar1 == -1) {
      if (err != (_Bool *)0x0) {
        *err = true;
      }
      log_formatted("Fail in %s, function: %s",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/validator.c"
                    ,"setup_sig_handlers");
    }
    else {
      iVar1 = sigaction(0xf,(sigaction *)&err_action,(sigaction *)0x0);
      if (iVar1 == -1) {
        if (err != (_Bool *)0x0) {
          *err = true;
        }
        log_formatted("Fail in %s, function: %s",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/validator.c"
                      ,"setup_sig_handlers");
      }
      else {
        iVar1 = sigemptyset((sigset_t *)&snt_success_action.sa_mask);
        if (iVar1 == -1) {
          if (err != (_Bool *)0x0) {
            *err = true;
          }
          log_formatted("Fail in %s, function: %s",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/validator.c"
                        ,"setup_sig_handlers");
        }
        else {
          snt_success_action.sa_flags = 0x10000000;
          snt_success_action.__sigaction_handler.sa_handler = sig_snt_success_handler;
          iVar1 = __libc_current_sigrtmin();
          iVar1 = sigaction(iVar1 + 1,(sigaction *)&snt_success_action,(sigaction *)0x0);
          if (iVar1 == -1) {
            if (err != (_Bool *)0x0) {
              *err = true;
            }
            log_formatted("Fail in %s, function: %s",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/validator.c"
                          ,"setup_sig_handlers");
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void setup_sig_handlers(bool *err) {
    assert(main_pid == getpid());

    int tmp_err;

    // error handler
    tmp_err = sigemptyset(&err_action.sa_mask);
    VOID_FAIL_IF(tmp_err == -1);

    err_action.sa_flags = 0;
    err_action.sa_handler = sig_err_handler;
    tmp_err = sigaction(SIGINT, &err_action, NULL);
    VOID_FAIL_IF(tmp_err == -1);

    tmp_err = sigaction(SIGTERM, &err_action, NULL);
    VOID_FAIL_IF(tmp_err == -1);

    // snt success handler
    tmp_err = sigemptyset(&snt_success_action.sa_mask);
    VOID_FAIL_IF(tmp_err == -1);

    snt_success_action.sa_flags = SA_RESTART; // prevent killing mq read when non-killing signal is received
    snt_success_action.sa_handler = sig_snt_success_handler;
    tmp_err = sigaction(SIG_SNT_SUCCESS, &snt_success_action, NULL);
    VOID_FAIL_IF(tmp_err == -1);
}